

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTransform.h
# Opt level: O0

void __thiscall
xmrig::BaseTransform::set<long>(BaseTransform *this,Document *doc,char *objKey,char *key,long value)

{
  bool bVar1;
  Value *in_RCX;
  Document *in_RDX;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RSI;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_RDI;
  char *in_R8;
  undefined4 unaff_retaddr;
  Type unaff_retaddr_00;
  StringRefType *in_stack_00000008;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_00000010;
  char *in_stack_ffffffffffffffa8;
  Ch *in_stack_ffffffffffffffb8;
  long in_stack_ffffffffffffffd0;
  
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)in_RDI,in_stack_ffffffffffffffb8);
  if (!bVar1) {
    rapidjson::StringRef<char>(in_stack_ffffffffffffffa8);
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::GetAllocator(in_RSI);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<rapidjson::Type>(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,in_RDI);
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
  operator[]<char_const>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(char *)in_RDI);
  set<long>((BaseTransform *)in_RSI,in_RDX,in_RCX,in_R8,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

inline void set(rapidjson::Document &doc, const char *objKey, const char *key, T value)
    {
        if (!doc.HasMember(objKey)) {
            doc.AddMember(rapidjson::StringRef(objKey), rapidjson::kObjectType, doc.GetAllocator());
        }

        set<T>(doc, doc[objKey], key, value);
    }